

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> __thiscall
Editor::makeCommand<commands::FlipTiles,Board&,bool&,bool>
          (Editor *this,Board *args,bool *args_1,bool *args_2)

{
  uint uVar1;
  size_type sVar2;
  deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  *pdVar3;
  type pCVar4;
  rep rVar5;
  unsigned_long uVar6;
  bool *in_RSI;
  FlipTiles *in_RDI;
  FlipTiles *lastCommandPtr;
  Command *lastCommand;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar7;
  deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  *this_00;
  _Head_base<0UL,_commands::FlipTiles_*,_false> this_01;
  bool *in_stack_ffffffffffffffc0;
  milliseconds in_stack_ffffffffffffffc8;
  
  this_01._M_head_impl = in_RDI;
  sVar2 = std::
          deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
          ::size((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                  *)0x197910);
  if (sVar2 != 0) {
    this_00 = *(deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                **)(in_RSI + 0xb18);
    pdVar3 = (deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
              *)std::
                deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                ::size((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                        *)0x197937);
    if (this_00 == pdVar3) {
      std::
      deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
      ::back((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
              *)this_01._M_head_impl);
      pCVar4 = std::unique_ptr<Command,_std::default_delete<Command>_>::operator*
                         ((unique_ptr<Command,_std::default_delete<Command>_> *)this_00);
      uVar1 = (*pCVar4->_vptr_Command[3])();
      uVar7 = false;
      if ((uVar1 & 1) != 0) {
        in_stack_ffffffffffffffc8 = Command::getTimeSinceLastExecute(&in_RDI->super_Command);
        rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffffc8);
        uVar7 = false;
        if (rVar5 < 1000) {
          uVar7 = std::type_info::operator==((type_info *)this_01._M_head_impl,(type_info *)in_RDI);
        }
      }
      if ((bool)uVar7 != false) {
        spdlog::debug<char[42]>((char (*) [42])0x1979e0);
        if (*(long *)(in_RSI + 0xb20) == *(long *)(in_RSI + 0xb18)) {
          uVar6 = std::numeric_limits<unsigned_long>::max();
          *(unsigned_long *)(in_RSI + 0xb20) = uVar6;
        }
        std::
        deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
        ::back((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
                *)this_01._M_head_impl);
        std::unique_ptr<Command,_std::default_delete<Command>_>::release
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)0x197a22);
        std::
        deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
        ::pop_back(this_00);
        *(long *)(in_RSI + 0xb18) = *(long *)(in_RSI + 0xb18) + -1;
        std::unique_ptr<commands::FlipTiles,std::default_delete<commands::FlipTiles>>::
        unique_ptr<std::default_delete<commands::FlipTiles>,void>
                  ((unique_ptr<commands::FlipTiles,_std::default_delete<commands::FlipTiles>_> *)
                   this_00,(pointer)CONCAT17(uVar7,in_stack_ffffffffffffff98));
        return (__uniq_ptr_data<commands::FlipTiles,_std::default_delete<commands::FlipTiles>,_true,_true>
                )(tuple<commands::FlipTiles_*,_std::default_delete<commands::FlipTiles>_>)
                 this_01._M_head_impl;
      }
    }
  }
  details::make_unique<commands::FlipTiles,_Board_&,_bool_&,_bool,_0>
            ((Board *)in_stack_ffffffffffffffc8.__r,in_stack_ffffffffffffffc0,in_RSI);
  return (__uniq_ptr_data<commands::FlipTiles,_std::default_delete<commands::FlipTiles>,_true,_true>
         )(tuple<commands::FlipTiles_*,_std::default_delete<commands::FlipTiles>_>)
          this_01._M_head_impl;
}

Assistant:

std::unique_ptr<T> Editor::makeCommand(Args&&... args) {
    if (editHistory_.size() > 0 && lastEditSize_ == editHistory_.size()) {
        // If the command has the same type as the previous one and happened
        // recently, we can just add on to it instead of building a new command.

        Command& lastCommand = *editHistory_.back();
        if (lastCommand.isGroupingAllowed() && lastCommand.getTimeSinceLastExecute().count() < 1000 && typeid(lastCommand) == typeid(T)) {
            spdlog::debug("Last command has same type, returning it.");
            if (savedEditSize_ == lastEditSize_) {
                savedEditSize_ = std::numeric_limits<size_t>::max();
            }
            auto lastCommandPtr = static_cast<T*>(editHistory_.back().release());
            editHistory_.pop_back();
            --lastEditSize_;
            return std::unique_ptr<T>(lastCommandPtr);
        }

        // FIXME: eventually we may want to replace the above typeid checking with a function that gets a command-type from an enum.
        // could use a string instead, then we don't need an enum that is aware of all the commands.
        // the command-type id could be passed as first argument to command ctor?
    }
    return details::make_unique<T>(std::forward<Args>(args)...);
}